

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtCompoundCollisionAlgorithm::processCollision
          (cbtCompoundCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  cbtManifoldArray *this_00;
  float fVar1;
  uint uVar2;
  cbtCollisionShape *pcVar3;
  cbtDbvt *this_01;
  cbtCollisionAlgorithm *pcVar4;
  cbtPersistentManifold *pcVar5;
  cbtTransform *pcVar6;
  long *plVar7;
  cbtDispatcher *pcVar8;
  cbtCollisionObjectWrapper *pcVar9;
  bool bVar10;
  ulong uVar11;
  cbtCollisionObjectWrapper *pcVar12;
  long lVar13;
  int m;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  cbtVector3 aabbMax0;
  cbtVector3 aabbMin0;
  cbtCompoundLeafCallback callback;
  cbtDbvtVolume bounds;
  cbtTransform otherInCompoundSpace;
  cbtTransform local_90;
  cbtVector3 aabbMax1;
  cbtVector3 aabbMin1;
  
  pcVar12 = body1Wrap;
  pcVar9 = body0Wrap;
  if (this->m_isSwapped != false) {
    pcVar12 = body0Wrap;
    pcVar9 = body1Wrap;
  }
  pcVar3 = pcVar9->m_shape;
  if (pcVar3[3].m_shapeType != this->m_compoundShapeRevision) {
    removeChildAlgorithms(this);
    preallocateChildAlgorithms(this,body0Wrap,body1Wrap);
    this->m_compoundShapeRevision = pcVar3[3].m_shapeType;
  }
  if ((this->m_childCollisionAlgorithms).m_size != 0) {
    callback.m_dispatcher =
         (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.m_dispatcher;
    callback.m_childCollisionAlgorithms = (this->m_childCollisionAlgorithms).m_data;
    callback.m_sharedManifold = this->m_sharedManifold;
    this_01 = (cbtDbvt *)pcVar3[3]._vptr_cbtCollisionShape;
    otherInCompoundSpace.m_basis.m_el[0].m_floats[0] = 0.0;
    otherInCompoundSpace.m_basis.m_el[0].m_floats[1] = 0.0;
    callback.super_ICollide._vptr_ICollide = (_func_int **)&PTR__ICollide_011943c0;
    this_00 = &this->manifoldArray;
    callback.m_compoundColObjWrap = pcVar9;
    callback.m_otherObjWrap = pcVar12;
    callback.m_dispatchInfo = dispatchInfo;
    callback.m_resultOut = resultOut;
    cbtAlignedObjectArray<cbtPersistentManifold_*>::resize
              (this_00,0,(cbtPersistentManifold **)&otherInCompoundSpace);
    for (lVar13 = 0; uVar2 = (this->m_childCollisionAlgorithms).m_size, lVar13 < (int)uVar2;
        lVar13 = lVar13 + 1) {
      pcVar4 = (this->m_childCollisionAlgorithms).m_data[lVar13];
      if (pcVar4 != (cbtCollisionAlgorithm *)0x0) {
        (*pcVar4->_vptr_cbtCollisionAlgorithm[4])();
        for (lVar14 = 0; lVar14 < (this->manifoldArray).m_size; lVar14 = lVar14 + 1) {
          pcVar5 = (this->manifoldArray).m_data[lVar14];
          if (pcVar5->m_cachedPoints != 0) {
            resultOut->m_manifoldPtr = pcVar5;
            cbtManifoldResult::refreshContactPoints(resultOut);
            resultOut->m_manifoldPtr = (cbtPersistentManifold *)0x0;
          }
        }
        otherInCompoundSpace.m_basis.m_el[0].m_floats[0] = 0.0;
        otherInCompoundSpace.m_basis.m_el[0].m_floats[1] = 0.0;
        cbtAlignedObjectArray<cbtPersistentManifold_*>::resize
                  (this_00,0,(cbtPersistentManifold **)&otherInCompoundSpace);
      }
    }
    if (this_01 == (cbtDbvt *)0x0) {
      lVar13 = 0x40;
      for (uVar11 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar11; uVar11 = uVar11 + 1) {
        cbtCompoundLeafCallback::ProcessChildShape
                  (&callback,*(cbtCollisionShape **)((long)pcVar3[1].m_userPointer + lVar13),
                   (int)uVar11);
        lVar13 = lVar13 + 0x58;
      }
    }
    else {
      cbtTransform::inverse(&local_90,pcVar9->m_worldTransform);
      cbtTransform::operator*((cbtTransform *)&bounds,&local_90,pcVar12->m_worldTransform);
      otherInCompoundSpace.m_basis.m_el[0].m_floats[0] = bounds.mi.m_floats[0];
      otherInCompoundSpace.m_basis.m_el[0].m_floats[1] = bounds.mi.m_floats[1];
      otherInCompoundSpace.m_basis.m_el[0].m_floats[2] = bounds.mi.m_floats[2];
      otherInCompoundSpace.m_basis.m_el[0].m_floats[3] = bounds.mi.m_floats[3];
      otherInCompoundSpace.m_basis.m_el[1].m_floats[0] = bounds.mx.m_floats[0];
      otherInCompoundSpace.m_basis.m_el[1].m_floats[1] = bounds.mx.m_floats[1];
      otherInCompoundSpace.m_basis.m_el[1].m_floats[2] = bounds.mx.m_floats[2];
      otherInCompoundSpace.m_basis.m_el[1].m_floats[3] = bounds.mx.m_floats[3];
      (*pcVar12->m_shape->_vptr_cbtCollisionShape[2])
                (pcVar12->m_shape,&otherInCompoundSpace,&aabbMin0,&aabbMax0);
      fVar1 = resultOut->m_closestPointDistanceThreshold;
      auVar15._4_4_ = fVar1;
      auVar15._0_4_ = fVar1;
      auVar15._8_4_ = fVar1;
      auVar15._12_4_ = fVar1;
      auVar16._8_8_ = 0;
      auVar16._0_4_ = aabbMin0.m_floats[0];
      auVar16._4_4_ = aabbMin0.m_floats[1];
      auVar15 = vsubps_avx(auVar16,auVar15);
      aabbMin0.m_floats._0_8_ = vmovlps_avx(auVar15);
      aabbMin0.m_floats[2] = aabbMin0.m_floats[2] - fVar1;
      bounds.mi.m_floats[3] = aabbMin0.m_floats[3];
      bounds.mi.m_floats[2] = aabbMin0.m_floats[2];
      auVar17._0_4_ = fVar1 + aabbMax0.m_floats[0];
      auVar17._4_4_ = fVar1 + aabbMax0.m_floats[1];
      auVar17._8_4_ = fVar1 + 0.0;
      auVar17._12_4_ = fVar1 + 0.0;
      aabbMax0.m_floats._0_8_ = vmovlps_avx(auVar17);
      aabbMax0.m_floats[2] = fVar1 + aabbMax0.m_floats[2];
      bounds.mx.m_floats[3] = aabbMax0.m_floats[3];
      bounds.mx.m_floats[2] = aabbMax0.m_floats[2];
      bounds.mi.m_floats._0_8_ = aabbMin0.m_floats._0_8_;
      bounds.mx.m_floats._0_8_ = aabbMax0.m_floats._0_8_;
      cbtDbvt::collideTVNoStackAlloc
                (this_01,this_01->m_root,&bounds,&this->stack2,&callback.super_ICollide);
    }
    uVar2 = (this->m_childCollisionAlgorithms).m_size;
    lVar13 = 0;
    otherInCompoundSpace.m_basis.m_el[0].m_floats[0] = 0.0;
    otherInCompoundSpace.m_basis.m_el[0].m_floats[1] = 0.0;
    cbtAlignedObjectArray<cbtPersistentManifold_*>::resize
              (this_00,0,(cbtPersistentManifold **)&otherInCompoundSpace);
    for (uVar11 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar11; uVar11 = uVar11 + 1) {
      if ((this->m_childCollisionAlgorithms).m_data[uVar11] != (cbtCollisionAlgorithm *)0x0) {
        pcVar6 = pcVar9->m_worldTransform;
        otherInCompoundSpace.m_basis.m_el[0].m_floats._0_8_ =
             *(undefined8 *)(pcVar6->m_basis).m_el[0].m_floats;
        otherInCompoundSpace.m_basis.m_el[0].m_floats._8_8_ =
             *(undefined8 *)((pcVar6->m_basis).m_el[0].m_floats + 2);
        plVar7 = *(long **)((long)pcVar3[1].m_userPointer + lVar13 + 0x40);
        otherInCompoundSpace.m_basis.m_el[1].m_floats._0_8_ =
             *(undefined8 *)(pcVar6->m_basis).m_el[1].m_floats;
        otherInCompoundSpace.m_basis.m_el[1].m_floats._8_8_ =
             *(undefined8 *)((pcVar6->m_basis).m_el[1].m_floats + 2);
        otherInCompoundSpace.m_basis.m_el[2].m_floats._0_8_ =
             *(undefined8 *)(pcVar6->m_basis).m_el[2].m_floats;
        otherInCompoundSpace.m_basis.m_el[2].m_floats._8_8_ =
             *(undefined8 *)((pcVar6->m_basis).m_el[2].m_floats + 2);
        otherInCompoundSpace.m_origin.m_floats._0_8_ = *(undefined8 *)(pcVar6->m_origin).m_floats;
        otherInCompoundSpace.m_origin.m_floats._8_8_ =
             *(undefined8 *)((pcVar6->m_origin).m_floats + 2);
        cbtTransform::operator*
                  (&local_90,&otherInCompoundSpace,
                   (cbtTransform *)((long)pcVar3[1].m_userPointer + lVar13));
        bounds.mi.m_floats[0] = local_90.m_basis.m_el[0].m_floats[0];
        bounds.mi.m_floats[1] = local_90.m_basis.m_el[0].m_floats[1];
        bounds.mi.m_floats[2] = local_90.m_basis.m_el[0].m_floats[2];
        bounds.mi.m_floats[3] = local_90.m_basis.m_el[0].m_floats[3];
        bounds.mx.m_floats[0] = local_90.m_basis.m_el[1].m_floats[0];
        bounds.mx.m_floats[1] = local_90.m_basis.m_el[1].m_floats[1];
        bounds.mx.m_floats[2] = local_90.m_basis.m_el[1].m_floats[2];
        bounds.mx.m_floats[3] = local_90.m_basis.m_el[1].m_floats[3];
        (**(code **)(*plVar7 + 0x10))(plVar7,&bounds,&aabbMin0,&aabbMax0);
        (*pcVar12->m_shape->_vptr_cbtCollisionShape[2])
                  (pcVar12->m_shape,pcVar12->m_worldTransform,&aabbMin1,&aabbMax1);
        bVar10 = TestAabbAgainstAabb2(&aabbMin0,&aabbMax0,&aabbMin1,&aabbMax1);
        if (!bVar10) {
          (**(this->m_childCollisionAlgorithms).m_data[uVar11]->_vptr_cbtCollisionAlgorithm)();
          pcVar8 = (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.
                   m_dispatcher;
          (*pcVar8->_vptr_cbtDispatcher[0xf])
                    (pcVar8,(this->m_childCollisionAlgorithms).m_data[uVar11]);
          (this->m_childCollisionAlgorithms).m_data[uVar11] = (cbtCollisionAlgorithm *)0x0;
        }
      }
      lVar13 = lVar13 + 0x58;
    }
  }
  return;
}

Assistant:

void cbtCompoundCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	const cbtCollisionObjectWrapper* colObjWrap = m_isSwapped ? body1Wrap : body0Wrap;
	const cbtCollisionObjectWrapper* otherObjWrap = m_isSwapped ? body0Wrap : body1Wrap;

	cbtAssert(colObjWrap->getCollisionShape()->isCompound());
	const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(colObjWrap->getCollisionShape());

	///cbtCompoundShape might have changed:
	////make sure the internal child collision algorithm caches are still valid
	if (compoundShape->getUpdateRevision() != m_compoundShapeRevision)
	{
		///clear and update all
		removeChildAlgorithms();

		preallocateChildAlgorithms(body0Wrap, body1Wrap);
		m_compoundShapeRevision = compoundShape->getUpdateRevision();
	}

	if (m_childCollisionAlgorithms.size() == 0)
		return;

	const cbtDbvt* tree = compoundShape->getDynamicAabbTree();
	//use a dynamic aabb tree to cull potential child-overlaps
	cbtCompoundLeafCallback callback(colObjWrap, otherObjWrap, m_dispatcher, dispatchInfo, resultOut, &m_childCollisionAlgorithms[0], m_sharedManifold);

	///we need to refresh all contact manifolds
	///note that we should actually recursively traverse all children, cbtCompoundShape can nested more then 1 level deep
	///so we should add a 'refreshManifolds' in the cbtCollisionAlgorithm
	{
		int i;
		manifoldArray.resize(0);
		for (i = 0; i < m_childCollisionAlgorithms.size(); i++)
		{
			if (m_childCollisionAlgorithms[i])
			{
				m_childCollisionAlgorithms[i]->getAllContactManifolds(manifoldArray);
				for (int m = 0; m < manifoldArray.size(); m++)
				{
					if (manifoldArray[m]->getNumContacts())
					{
						resultOut->setPersistentManifold(manifoldArray[m]);
						resultOut->refreshContactPoints();
						resultOut->setPersistentManifold(0);  //??necessary?
					}
				}
				manifoldArray.resize(0);
			}
		}
	}

	if (tree)
	{
		cbtVector3 localAabbMin, localAabbMax;
		cbtTransform otherInCompoundSpace;
		otherInCompoundSpace = colObjWrap->getWorldTransform().inverse() * otherObjWrap->getWorldTransform();
		otherObjWrap->getCollisionShape()->getAabb(otherInCompoundSpace, localAabbMin, localAabbMax);
		cbtVector3 extraExtends(resultOut->m_closestPointDistanceThreshold, resultOut->m_closestPointDistanceThreshold, resultOut->m_closestPointDistanceThreshold);
		localAabbMin -= extraExtends;
		localAabbMax += extraExtends;

		const ATTRIBUTE_ALIGNED16(cbtDbvtVolume) bounds = cbtDbvtVolume::FromMM(localAabbMin, localAabbMax);
		//process all children, that overlap with  the given AABB bounds
		tree->collideTVNoStackAlloc(tree->m_root, bounds, stack2, callback);
	}
	else
	{
		//iterate over all children, perform an AABB check inside ProcessChildShape
		int numChildren = m_childCollisionAlgorithms.size();
		int i;
		for (i = 0; i < numChildren; i++)
		{
			callback.ProcessChildShape(compoundShape->getChildShape(i), i);
		}
	}

	{
		//iterate over all children, perform an AABB check inside ProcessChildShape
		int numChildren = m_childCollisionAlgorithms.size();
		int i;
		manifoldArray.resize(0);
		const cbtCollisionShape* childShape = 0;
		cbtTransform orgTrans;

		cbtTransform newChildWorldTrans;
		cbtVector3 aabbMin0, aabbMax0, aabbMin1, aabbMax1;

		for (i = 0; i < numChildren; i++)
		{
			if (m_childCollisionAlgorithms[i])
			{
				childShape = compoundShape->getChildShape(i);
				//if not longer overlapping, remove the algorithm
				orgTrans = colObjWrap->getWorldTransform();

				const cbtTransform& childTrans = compoundShape->getChildTransform(i);
				newChildWorldTrans = orgTrans * childTrans;

				//perform an AABB check first
				childShape->getAabb(newChildWorldTrans, aabbMin0, aabbMax0);
				otherObjWrap->getCollisionShape()->getAabb(otherObjWrap->getWorldTransform(), aabbMin1, aabbMax1);

				if (!TestAabbAgainstAabb2(aabbMin0, aabbMax0, aabbMin1, aabbMax1))
				{
					m_childCollisionAlgorithms[i]->~cbtCollisionAlgorithm();
					m_dispatcher->freeCollisionAlgorithm(m_childCollisionAlgorithms[i]);
					m_childCollisionAlgorithms[i] = 0;
				}
			}
		}
	}
}